

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

CppTypeName * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::cppFullName
          (CppTypeName *__return_storage_ptr__,CapnpcCppMain *this,Schema schema,Schema brand,
          Maybe<capnp::InterfaceSchema::Method> *method)

{
  Reader brand_00;
  undefined1 auVar1 [40];
  Reader proto;
  Reader proto_00;
  Reader proto_01;
  NullableValue<capnp::InterfaceSchema::Method> *pNVar2;
  ElementCount EVar3;
  CppTypeName *pCVar4;
  int iVar5;
  undefined8 uVar6;
  Waiter *pWVar7;
  Predicate *pPVar8;
  CppTypeName *extraout_RAX;
  CppTypeName *extraout_RAX_00;
  undefined4 extraout_var;
  CppTypeName *pCVar9;
  ulong uVar10;
  Waiter *pWVar11;
  Predicate *pPVar12;
  uint64_t annotationId;
  ArrayPtr<const_char> *params_00;
  uint64_t uVar13;
  ElementCount EVar14;
  CapnpcCppMain *this_00;
  uint index;
  size_t sVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ArrayPtr<const_char> innerName;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar20;
  Reader RVar21;
  StringPtr SVar22;
  Type type;
  StringPtr name;
  StringPtr name_00;
  String ownUnqualifiedName;
  ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> builder;
  Fault f;
  Reader node;
  Reader params;
  Schema parent;
  Fault f_1;
  BrandArgumentList args;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_240;
  char *local_238;
  CppTypeName *local_228;
  CppTypeName *pCStack_220;
  CppTypeName *local_218;
  undefined1 local_208 [16];
  CppTypeName *local_1f8;
  ArrayDisposer *local_1f0;
  NullableValue<capnp::InterfaceSchema::Method> local_1e8;
  Reader local_198;
  undefined1 local_168 [64];
  CppTypeName local_128;
  Array<capnp::(anonymous_namespace)::CppTypeName> local_e8;
  size_t local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Schema local_98;
  BrandArgumentList local_90;
  Maybe<capnp::InterfaceSchema::Method> local_78;
  
  local_168._56_8_ = brand.raw;
  local_98.raw = schema.raw;
  Schema::getProto(&local_198,&local_98);
  if (local_198._reader.dataSize < 0xc0) {
    if (0x6f < local_198._reader.dataSize) goto LAB_00163982;
    if (local_198._reader.dataSize < 0x40) {
      local_128.name.size_ = 0;
      goto LAB_001639eb;
    }
  }
  else {
    uVar13 = *(uint64_t *)
              (CONCAT44(local_198._reader.data._4_4_,local_198._reader.data._0_4_) + 0x10);
    if (uVar13 != 0) {
      local_a8 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      uStack_a0 = 0x7fffffff;
      auVar1 = ZEXT1640(ZEXT816(0));
      brand_00._reader._40_8_ = 0x7fffffff;
      brand_00._reader.segment = (SegmentReader *)auVar1._0_8_;
      brand_00._reader.capTable = (CapTableReader *)auVar1._8_8_;
      brand_00._reader.data = (void *)auVar1._16_8_;
      brand_00._reader.pointers = (WirePointer *)auVar1._24_8_;
      brand_00._reader.dataSize = auVar1._32_4_;
      brand_00._reader.pointerCount = auVar1._36_2_;
      brand_00._reader._38_2_ = auVar1._38_2_;
      local_168._48_8_ = SchemaLoader::get(&this->schemaLoader,uVar13,brand_00,(Schema)0x27d320);
      local_228 = (CppTypeName *)0x0;
      pCStack_220 = (CppTypeName *)0x0;
      local_218 = (CppTypeName *)0x0;
      proto._reader.segment._4_4_ = local_198._reader.segment._4_4_;
      proto._reader.segment._0_4_ = local_198._reader.segment._0_4_;
      proto._reader.capTable._4_4_ = local_198._reader.capTable._4_4_;
      proto._reader.capTable._0_4_ = local_198._reader.capTable._0_4_;
      proto._reader.pointerCount = local_198._reader.pointerCount;
      proto._reader.dataSize = local_198._reader.dataSize;
      proto._reader._38_2_ = local_198._reader._38_2_;
      proto._reader._44_4_ = local_198._reader._44_4_;
      proto._reader.nestingLimit = local_198._reader.nestingLimit;
      proto._reader.data._0_4_ = local_198._reader.data._0_4_;
      proto._reader.data._4_4_ = local_198._reader.data._4_4_;
      proto._reader.pointers._0_4_ = local_198._reader.pointers._0_4_;
      proto._reader.pointers._4_4_ = local_198._reader.pointers._4_4_;
      annotationValue<capnp::schema::Node::Reader>
                ((Maybe<capnp::schema::Value::Reader> *)&local_1e8,
                 (CapnpcCppMain *)0xf264a779fef191ce,proto,annotationId);
      if (local_1e8.isSet == true) {
        bVar16 = local_1e8.field_1._36_2_ == 0;
        uVar6 = local_1e8.field_1.value.proto._reader.capTable;
        if (bVar16) {
          uVar6 = (Branch *)0x0;
        }
        uVar17 = 0x7fffffff;
        if (!bVar16) {
          uVar17 = local_1e8.field_1._40_4_;
        }
        local_1e8._0_4_ = 0;
        local_1e8._4_4_ = 0;
        uVar18 = 0;
        uVar19 = 0;
        if (!bVar16) {
          local_1e8._0_4_ = local_1e8.field_1._0_4_;
          local_1e8._4_4_ = local_1e8.field_1._4_4_;
          uVar18 = local_1e8.field_1._8_4_;
          uVar19 = local_1e8.field_1._12_4_;
        }
        local_1e8.field_1._4_4_ = uVar19;
        local_1e8.field_1._0_4_ = uVar18;
        local_1e8.field_1._16_4_ = uVar17;
        local_1e8.field_1._8_8_ = uVar6;
        innerName = (ArrayPtr<const_char>)
                    _::PointerReader::getBlob<capnp::Text>
                              ((PointerReader *)&local_1e8,(void *)0x0,0);
LAB_00163dc6:
        local_238 = innerName.ptr;
        local_78.ptr.isSet = (method->ptr).isSet;
        if (local_78.ptr.isSet == true) {
          local_78.ptr.field_1.value.parent.super_Schema.raw =
               (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
          local_78.ptr.field_1._8_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
          local_78.ptr.field_1.value.proto._reader.segment =
               (method->ptr).field_1.value.proto._reader.segment;
          local_78.ptr.field_1.value.proto._reader.capTable =
               (method->ptr).field_1.value.proto._reader.capTable;
          local_78.ptr.field_1.value.proto._reader.data =
               (method->ptr).field_1.value.proto._reader.data;
          local_78.ptr.field_1.value.proto._reader.pointers =
               (method->ptr).field_1.value.proto._reader.pointers;
          pNVar2 = &method->ptr;
          local_78.ptr.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar2->field_1 + 0x30);
          local_78.ptr.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar2->field_1 + 0x34);
          local_78.ptr.field_1._54_2_ = *(undefined2 *)((long)&pNVar2->field_1 + 0x36);
          local_78.ptr.field_1._56_8_ =
               *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
        }
        cppFullName(__return_storage_ptr__,this,(Schema)local_168._48_8_,(Schema)local_168._56_8_,
                    &local_78);
        local_1e8.field_1._8_8_ =
             (CapTableReader *)
             (CONCAT44(local_198._reader.pointers._4_4_,local_198._reader.pointers._0_4_) + 0x28);
        if (local_198._reader.pointerCount < 6) {
          local_1e8.field_1._8_8_ = (CapTableReader *)0x0;
        }
        if (local_198._reader.pointerCount < 6) {
          local_198._reader.segment._0_4_ = 0;
          local_198._reader.segment._4_4_ = 0;
          local_198._reader.capTable._0_4_ = 0;
          local_198._reader.capTable._4_4_ = 0;
          local_198._reader.nestingLimit = 0x7fffffff;
        }
        local_1e8._4_4_ = local_198._reader.segment._4_4_;
        local_1e8._0_4_ = local_198._reader.segment._0_4_;
        local_1e8.field_1._4_4_ = local_198._reader.capTable._4_4_;
        local_1e8.field_1._0_4_ = local_198._reader.capTable._0_4_;
        local_1e8.field_1._16_4_ = local_198._reader.nestingLimit;
        _::PointerReader::getList
                  ((ListReader *)local_168,(PointerReader *)&local_1e8,INLINE_COMPOSITE,(word *)0x0)
        ;
        if (local_168._24_4_ == 0) {
          CppTypeName::addMemberType(__return_storage_ptr__,(StringPtr)innerName);
          pCVar9 = extraout_RAX;
        }
        else {
          if (local_198._reader.dataSize < 0x40) {
            uVar13 = 0;
          }
          else {
            uVar13 = *(uint64_t *)
                      CONCAT44(local_198._reader.data._4_4_,local_198._reader.data._0_4_);
          }
          Schema::getBrandArgumentsAtScope(&local_90,(Schema *)(local_168 + 0x38),uVar13);
          uVar17 = local_168._24_4_;
          uVar10 = (ulong)(uint)local_168._24_4_;
          local_208._8_8_ =
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x40,0,uVar10,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
          local_1f8 = (CppTypeName *)(local_208._8_8_ + uVar10 * 0x40);
          local_1f0 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
          sVar15 = innerName.size_;
          local_208._0_8_ = local_208._8_8_;
          if (uVar10 != 0) {
            index = 0;
            local_d0 = innerName.size_;
            do {
              type = Schema::BrandArgumentList::operator[](&local_90,index);
              bVar16 = (method->ptr).isSet;
              local_1e8.isSet = bVar16;
              if (bVar16 == true) {
                local_1e8.field_1.value.parent.super_Schema.raw =
                     (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
                local_1e8.field_1._8_8_ = *(long *)((long)&(method->ptr).field_1 + 8);
                local_1e8.field_1.value.proto._reader.segment =
                     (method->ptr).field_1.value.proto._reader.segment;
                local_1e8.field_1.value.proto._reader.capTable =
                     (method->ptr).field_1.value.proto._reader.capTable;
                local_1e8.field_1.value.proto._reader.data =
                     (method->ptr).field_1.value.proto._reader.data;
                local_1e8.field_1.value.proto._reader.pointers =
                     (method->ptr).field_1.value.proto._reader.pointers;
                pNVar2 = &method->ptr;
                local_1e8.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar2->field_1 + 0x30);
                local_1e8.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar2->field_1 + 0x34);
                local_1e8.field_1._54_2_ = *(undefined2 *)((long)&pNVar2->field_1 + 0x36);
                local_1e8.field_1._56_8_ =
                     *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
              }
              typeName((CppTypeName *)(local_168 + 0x40),this,type,
                       (Maybe<capnp::InterfaceSchema::Method> *)&local_1e8);
              ((StringTree *)local_208._8_8_)->size_ = local_128.name.size_;
              (((StringTree *)local_208._8_8_)->text).content.ptr = local_128.name.text.content.ptr;
              (((StringTree *)local_208._8_8_)->text).content.size_ =
                   local_128.name.text.content.size_;
              local_128.name.text.content.ptr = (char *)0x0;
              local_128.name.text.content.size_ = 0;
              (((StringTree *)local_208._8_8_)->text).content.disposer =
                   (ArrayDisposer *)
                   CONCAT44(local_128.name.text.content.disposer._4_4_,
                            (ElementCount)local_128.name.text.content.disposer);
              (((StringTree *)local_208._8_8_)->branches).ptr = local_128.name.branches.ptr;
              (((StringTree *)local_208._8_8_)->branches).size_ = local_128.name.branches.size_;
              (((StringTree *)local_208._8_8_)->branches).disposer =
                   local_128.name.branches.disposer;
              local_128.name.branches.ptr = (Branch *)0x0;
              local_128.name.branches.size_ = 0;
              *(undefined4 *)(local_208._8_8_ + 0x38) = local_128._56_4_;
              local_208._8_8_ = local_208._8_8_ + 0x40;
              index = index + 1;
              sVar15 = local_d0;
            } while (uVar17 != index);
          }
          local_e8.size_ = (long)(local_208._8_8_ - local_208._0_8_) >> 6;
          SVar22.content.size_ = sVar15;
          SVar22.content.ptr = local_238;
          local_e8.ptr = (CppTypeName *)local_208._0_8_;
          local_e8.disposer = local_1f0;
          CppTypeName::addMemberTemplate(__return_storage_ptr__,SVar22,&local_e8);
          sVar15 = local_e8.size_;
          pCVar4 = local_e8.ptr;
          pCVar9 = extraout_RAX_00;
          if (local_e8.ptr != (CppTypeName *)0x0) {
            local_e8.ptr = (CppTypeName *)0x0;
            local_e8.size_ = 0;
            iVar5 = (**(local_e8.disposer)->_vptr_ArrayDisposer)
                              (local_e8.disposer,pCVar4,0x40,sVar15,sVar15,
                               kj::ArrayDisposer::
                               Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::destruct)
            ;
            pCVar9 = (CppTypeName *)CONCAT44(extraout_var,iVar5);
          }
        }
        if (local_228 == (CppTypeName *)0x0) {
          return pCVar9;
        }
        pCVar9 = (CppTypeName *)
                 (**(code **)(local_218->name).size_)
                           (local_218,local_228,1,pCStack_220,pCStack_220,0);
        return pCVar9;
      }
      Schema::getProto((Reader *)&local_1e8,(Schema *)(local_168 + 0x30));
      local_168._16_8_ = &(local_1e8.field_1.value.proto._reader.segment)->id;
      if ((ushort)local_1e8.field_1._28_2_ < 2) {
        local_168._16_8_ = (Waiter *)0x0;
      }
      if ((ushort)local_1e8.field_1._28_2_ < 2) {
        local_168[0] = false;
        local_168._1_3_ = 0;
        local_168._4_4_ = 0;
        local_168._8_4_ = 0;
        local_168._12_4_ = 0;
        local_168._24_4_ = 0x7fffffff;
      }
      else {
        local_168._0_4_ = local_1e8._0_4_;
        local_168._4_4_ = local_1e8._4_4_;
        local_168._8_4_ = local_1e8.field_1._0_4_;
        local_168._12_4_ = local_1e8.field_1._4_4_;
        local_168._24_4_ = local_1e8.field_1._32_4_;
      }
      _::PointerReader::getList
                ((ListReader *)(local_168 + 0x40),(PointerReader *)local_168,INLINE_COMPOSITE,
                 (word *)0x0);
      EVar3 = (ElementCount)local_128.name.text.content.disposer;
      if ((ElementCount)local_128.name.text.content.disposer != 0) {
        EVar14 = 0;
        do {
          _::ListReader::getStructElement
                    ((StructReader *)local_168,(ListReader *)(local_168 + 0x40),EVar14);
          if ((uint)local_168._32_4_ < 0x40) {
            pWVar7 = (Waiter *)0x0;
          }
          else {
            pWVar7 = ((Maybe<kj::_::Mutex::Waiter_&> *)local_168._16_8_)->ptr;
          }
          if (local_198._reader.dataSize < 0x40) {
            pWVar11 = (Waiter *)0x0;
          }
          else {
            pWVar11 = *(Waiter **)
                       CONCAT44(local_198._reader.data._4_4_,local_198._reader.data._0_4_);
          }
          if (pWVar7 == pWVar11) {
            bVar16 = local_168._36_2_ == 0;
            local_1f8 = (CppTypeName *)CONCAT44(local_168._28_4_,local_168._24_4_);
            if (bVar16) {
              local_1f8 = (CppTypeName *)0x0;
            }
            iVar5 = 0x7fffffff;
            if (!bVar16) {
              iVar5 = local_168._40_4_;
            }
            uVar17._0_1_ = false;
            uVar17._1_3_ = 0;
            local_208._4_4_ = 0;
            local_208._8_4_ = 0;
            local_208._12_4_ = 0;
            if (!bVar16) {
              uVar17 = local_168._0_4_;
              local_208._4_4_ = local_168._4_4_;
              local_208._8_4_ = local_168._8_4_;
              local_208._12_4_ = local_168._12_4_;
            }
            local_208[0] = SUB41(uVar17,0);
            local_208._1_3_ = SUB43(uVar17,1);
            local_1f0 = (ArrayDisposer *)CONCAT44(local_1f0._4_4_,iVar5);
            innerName = (ArrayPtr<const_char>)
                        _::PointerReader::getBlob<capnp::Text>
                                  ((PointerReader *)local_208,(void *)0x0,0);
            if (innerName.size_ < 2) goto LAB_00163bbd;
            goto LAB_00163dc6;
          }
          EVar14 = EVar14 + 1;
        } while (EVar3 != EVar14);
      }
      innerName.size_ = 1;
      innerName.ptr = "";
LAB_00163bbd:
      if ((0x6f < (uint)local_1e8.field_1._24_4_) &&
         (*(short *)(local_1e8.field_1._8_8_ + 0xc) == 1)) {
        local_168._16_8_ = &((local_1e8.field_1.value.proto._reader.segment)->ptr).size_;
        if ((ushort)local_1e8.field_1._28_2_ < 4) {
          local_168._16_8_ = (Waiter *)0x0;
        }
        if ((ushort)local_1e8.field_1._28_2_ < 4) {
          local_168[0] = false;
          local_168._1_3_ = 0;
          local_168._4_4_ = 0;
          local_168._8_4_ = 0;
          local_168._12_4_ = 0;
          local_168._24_4_ = 0x7fffffff;
        }
        else {
          local_168._0_4_ = local_1e8._0_4_;
          local_168._4_4_ = local_1e8._4_4_;
          local_168._8_4_ = local_1e8.field_1._0_4_;
          local_168._12_4_ = local_1e8.field_1._4_4_;
          local_168._24_4_ = local_1e8.field_1._32_4_;
        }
        _::PointerReader::getList
                  ((ListReader *)(local_168 + 0x40),(PointerReader *)local_168,INLINE_COMPOSITE,
                   (word *)0x0);
        EVar3 = (ElementCount)local_128.name.text.content.disposer;
        if ((ElementCount)local_128.name.text.content.disposer != 0) {
          EVar14 = 0;
          do {
            this_00 = (CapnpcCppMain *)local_168;
            _::ListReader::getStructElement
                      ((StructReader *)local_168,(ListReader *)(local_168 + 0x40),EVar14);
            if ((0x4f < (uint)local_168._32_4_) && (*(short *)(local_168._16_8_ + 8) == 1)) {
              if ((uint)local_168._32_4_ < 0xc0) {
                pPVar8 = (Predicate *)0x0;
              }
              else {
                pPVar8 = *(Predicate **)(local_168._16_8_ + 0x10);
              }
              if (local_198._reader.dataSize < 0x40) {
                pPVar12 = (Predicate *)0x0;
              }
              else {
                pPVar12 = *(Predicate **)
                           CONCAT44(local_198._reader.data._4_4_,local_198._reader.data._0_4_);
              }
              if (pPVar8 == pPVar12) {
                proto_01._reader.segment._4_4_ = local_168._4_4_;
                proto_01._reader.segment._0_4_ = local_168._0_4_;
                proto_01._reader.capTable._4_4_ = local_168._12_4_;
                proto_01._reader.capTable._0_4_ = local_168._8_4_;
                proto_01._reader.pointerCount = local_168._36_2_;
                proto_01._reader.dataSize = local_168._32_4_;
                proto_01._reader._38_2_ = local_168._38_2_;
                proto_01._reader._44_4_ = local_168._44_4_;
                proto_01._reader.nestingLimit = local_168._40_4_;
                proto_01._reader.data._0_4_ = (int)local_168._16_8_;
                proto_01._reader.data._4_4_ = SUB84(local_168._16_8_,4);
                proto_01._reader.pointers._0_4_ = local_168._24_4_;
                proto_01._reader.pointers._4_4_ = local_168._28_4_;
                SVar22 = protoName<capnp::schema::Field::Reader>(this_00,proto_01);
                name_00.content.ptr = (char *)SVar22.content.size_;
                name_00.content.size_ = (size_t)pPVar12;
                toTitleCase((String *)local_208,(CapnpcCppMain *)SVar22.content.ptr,name_00);
                local_228 = (CppTypeName *)local_208._0_8_;
                pCStack_220 = (CppTypeName *)local_208._8_8_;
                pCVar9 = (CppTypeName *)0x2214ff;
                if ((CppTypeName *)local_208._8_8_ != (CppTypeName *)0x0) {
                  pCVar9 = (CppTypeName *)local_208._0_8_;
                }
                local_218 = local_1f8;
                innerName.size_ =
                     (size_t)((long)&((StringTree *)local_208._8_8_)->size_ +
                             (ulong)((CppTypeName *)local_208._8_8_ == (CppTypeName *)0x0));
                innerName.ptr = (char *)pCVar9;
                break;
              }
            }
            EVar14 = EVar14 + 1;
          } while (EVar3 != EVar14);
          if (1 < innerName.size_) goto LAB_00163dc6;
        }
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[73]>
                ((Fault *)(local_168 + 0x40),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                 ,0x19b,FAILED,"unqualifiedName != nullptr",
                 "\"A schema Node\'s supposed scope did not contain the node as a NestedNode.\"",
                 (char (*) [73])
                 "A schema Node\'s supposed scope did not contain the node as a NestedNode.");
      kj::_::Debug::Fault::fatal((Fault *)(local_168 + 0x40));
    }
LAB_00163982:
    if (*(short *)(CONCAT44(local_198._reader.data._4_4_,local_198._reader.data._0_4_) + 0xc) != 0)
    {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[72]>
                ((Fault *)&local_1e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                 ,0x174,FAILED,"node.isFile()",
                 "\"Non-file had scopeId zero; perhaps it\'s a method param / result struct?\"",
                 (char (*) [72])
                 "Non-file had scopeId zero; perhaps it\'s a method param / result struct?");
      kj::_::Debug::Fault::fatal((Fault *)&local_1e8);
    }
  }
  local_128.name.size_ =
       *(undefined8 *)CONCAT44(local_198._reader.data._4_4_,local_198._reader.data._0_4_);
LAB_001639eb:
  local_240 = &this->usedImports;
  local_1e8._0_8_ = local_240;
  pVar20 = std::
           _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           ::
           _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                     ();
  proto_00._reader.segment._4_4_ = local_198._reader.segment._4_4_;
  proto_00._reader.segment._0_4_ = local_198._reader.segment._0_4_;
  proto_00._reader.capTable._4_4_ = local_198._reader.capTable._4_4_;
  proto_00._reader.capTable._0_4_ = local_198._reader.capTable._0_4_;
  proto_00._reader.pointerCount = local_198._reader.pointerCount;
  proto_00._reader.dataSize = local_198._reader.dataSize;
  proto_00._reader._38_2_ = local_198._reader._38_2_;
  proto_00._reader._44_4_ = local_198._reader._44_4_;
  proto_00._reader.nestingLimit = local_198._reader.nestingLimit;
  proto_00._reader.data._0_4_ = local_198._reader.data._0_4_;
  proto_00._reader.data._4_4_ = local_198._reader.data._4_4_;
  proto_00._reader.pointers._0_4_ = local_198._reader.pointers._0_4_;
  proto_00._reader.pointers._4_4_ = local_198._reader.pointers._4_4_;
  annotationValue<capnp::schema::Node::Reader>
            ((Maybe<capnp::schema::Value::Reader> *)&local_1e8,(CapnpcCppMain *)0xb9c6f99ebf805f2c,
             proto_00,pVar20._8_8_);
  if (local_1e8.isSet == true) {
    bVar16 = local_1e8.field_1._36_2_ == 0;
    if (bVar16) {
      local_1e8.field_1.value.proto._reader.capTable = (CapTableReader *)(Branch *)0x0;
    }
    uVar10 = 0x7fffffff;
    if (!bVar16) {
      uVar10 = (ulong)local_1e8.field_1.value.proto._reader.pointers & 0xffffffff;
    }
    local_1e8._0_4_ = 0;
    local_1e8._4_4_ = 0;
    uVar17 = 0;
    uVar18 = 0;
    if (!bVar16) {
      local_1e8._0_4_ = local_1e8.field_1._0_4_;
      local_1e8._4_4_ = local_1e8.field_1._4_4_;
      uVar17 = local_1e8.field_1._8_4_;
      uVar18 = local_1e8.field_1._12_4_;
    }
    local_1e8.field_1._4_4_ = uVar18;
    local_1e8.field_1._0_4_ = uVar17;
    local_1e8.field_1._16_4_ = (int)uVar10;
    local_1e8.field_1._8_8_ = local_1e8.field_1.value.proto._reader.capTable;
    RVar21 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_1e8,(void *)0x0,0);
    name.content.ptr = RVar21.super_StringPtr.content.size_;
    name.content.size_ = uVar10;
    local_1e8.field_1.value.proto._reader.pointers =
         (WirePointer *)
         CppTypeName::makeNamespace(__return_storage_ptr__,RVar21.super_StringPtr.content.ptr,name);
  }
  else {
    local_128.name.size_ = 0x220bfd;
    local_128.name.text.content.ptr = (char *)0x1;
    kj::StringTree::concat<kj::ArrayPtr<char_const>>
              ((StringTree *)&local_1e8,(StringTree *)(local_168 + 0x40),params_00);
    (__return_storage_ptr__->name).size_ = local_1e8._0_8_;
    (__return_storage_ptr__->name).text.content.ptr =
         (char *)local_1e8.field_1.value.parent.super_Schema.raw;
    (__return_storage_ptr__->name).text.content.size_ = local_1e8.field_1._8_8_;
    (__return_storage_ptr__->name).text.content.disposer =
         (ArrayDisposer *)local_1e8.field_1.value.proto._reader.segment;
    (__return_storage_ptr__->name).branches.ptr =
         (Branch *)local_1e8.field_1.value.proto._reader.capTable;
    (__return_storage_ptr__->name).branches.size_ =
         (size_t)local_1e8.field_1.value.proto._reader.data;
    (__return_storage_ptr__->name).branches.disposer =
         (ArrayDisposer *)local_1e8.field_1.value.proto._reader.pointers;
    __return_storage_ptr__->isArgDependent = false;
    __return_storage_ptr__->needsTypename = false;
    __return_storage_ptr__->hasInterfaces_ = false;
    __return_storage_ptr__->hasDisambiguatedTemplate_ = false;
  }
  return (CppTypeName *)local_1e8.field_1.value.proto._reader.pointers;
}

Assistant:

CppTypeName cppFullName(Schema schema, Schema brand, kj::Maybe<InterfaceSchema::Method> method) {
    auto node = schema.getProto();

    if (node.getScopeId() == 0) {
      // This is the file-level scope. Search for the namespace annotation.
      KJ_REQUIRE(node.isFile(),
          "Non-file had scopeId zero; perhaps it's a method param / result struct?");
      usedImports.insert(node.getId());
      KJ_IF_MAYBE(ns, annotationValue(node, NAMESPACE_ANNOTATION_ID)) {
        return CppTypeName::makeNamespace(ns->getText());
      } else {
        return CppTypeName::makeRoot();
      }
    }